

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void testing::internal::WriteToShardStatusFileIfNeeded(void)

{
  char *__filename;
  FILE *__stream;
  
  __filename = getenv("GTEST_SHARD_STATUS_FILE");
  if (__filename == (char *)0x0) {
    return;
  }
  __stream = fopen(__filename,"w");
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
    return;
  }
  ColoredPrintf(kRed,
                "Could not write to the test shard status file \"%s\" specified by the %s environment variable.\n"
                ,__filename,"GTEST_SHARD_STATUS_FILE");
  fflush(_stdout);
  exit(1);
}

Assistant:

bool String::CaseInsensitiveCStringEquals(const char* lhs, const char* rhs) {
  if (lhs == nullptr) return rhs == nullptr;
  if (rhs == nullptr) return false;
  return posix::StrCaseCmp(lhs, rhs) == 0;
}